

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdCopyErrorState(void *source,void *destination)

{
  CfdCapiManager *this;
  
  this = (CfdCapiManager *)source;
  cfd::Initialize();
  cfd::capi::CfdCapiManager::CopyHandle(this,source,destination,true);
  return 0;
}

Assistant:

int CfdCopyErrorState(void* source, void* destination) {
  try {
    cfd::Initialize();
    cfd::capi::capi_instance.CopyHandle(source, destination, true);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}